

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanePart.cpp
# Opt level: O2

vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_> * __thiscall
PlanePart::nextPlanePartPossible
          (vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
           *__return_storage_ptr__,PlanePart *this,bool action)

{
  undefined3 in_register_00000011;
  pair<double,_PlanePart> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (CONCAT31(in_register_00000011,action) == 0) {
    if (this->whichPente == true) {
      local_48.second.frequency = this->frequency + this->pente1;
      local_48.first = 1.0;
      local_48.second.pente0 = 0.1;
      local_48.second.pente1 = 1.0;
      local_48.second.seuil = 3.0;
      local_48.second.probaP0 = 0.9;
      local_48.second.whichPente = true;
      std::vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>::
      emplace_back<std::pair<double,PlanePart>>
                ((vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>> *)
                 __return_storage_ptr__,&local_48);
    }
    else {
      local_48.first = this->probaP0;
      local_48.second.frequency = this->frequency + this->pente0;
      local_48.second.pente0 = 0.1;
      local_48.second.pente1 = 1.0;
      local_48.second.seuil = 3.0;
      local_48.second.probaP0 = 0.9;
      local_48.second.whichPente = false;
      std::vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>::
      emplace_back<std::pair<double,PlanePart>>
                ((vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>> *)
                 __return_storage_ptr__,&local_48);
      local_48.first = 1.0 - this->probaP0;
      local_48.second.frequency = this->frequency + this->pente1;
      local_48.second.pente0 = 0.1;
      local_48.second.pente1 = 1.0;
      local_48.second.seuil = 3.0;
      local_48.second.probaP0 = 0.9;
      local_48.second.whichPente = true;
      std::vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>::
      emplace_back<std::pair<double,PlanePart>>
                ((vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>> *)
                 __return_storage_ptr__,&local_48);
    }
  }
  else {
    local_48.second.frequency = this->pente0;
    local_48.first = this->probaP0;
    local_48.second.pente0 = 0.1;
    local_48.second.pente1 = 1.0;
    local_48.second.seuil = 3.0;
    local_48.second.probaP0 = 0.9;
    local_48.second.whichPente = false;
    std::vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>::
    emplace_back<std::pair<double,PlanePart>>
              ((vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>> *)
               __return_storage_ptr__,&local_48);
    local_48.first = 1.0 - this->probaP0;
    local_48.second.frequency = this->pente1;
    local_48.second.pente0 = 0.1;
    local_48.second.pente1 = 1.0;
    local_48.second.seuil = 3.0;
    local_48.second.probaP0 = 0.9;
    local_48.second.whichPente = true;
    std::vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>::
    emplace_back<std::pair<double,PlanePart>>
              ((vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>> *)
               __return_storage_ptr__,&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<pair<double,PlanePart>> PlanePart::nextPlanePartPossible(bool action) const {
    vector<pair<double,PlanePart>> PlanePartWithProba;

    // Cas où on ne change pas la pièce
    if (!action) {
        // Cas où l'on est sur la pente haute
        if (whichPente) {
            PlanePartWithProba.push_back(pair<double,PlanePart>(1, PlanePart(frequency + pente1, whichPente)));
        }
        // Cas où l'on est sur la pente basse
        else {
            // On reste sur la pente basse...
            PlanePartWithProba.push_back(pair<double,PlanePart>(probaP0, PlanePart(frequency + pente0, false)));
            // ... ou on bascule sur la pente haute
            PlanePartWithProba.push_back(pair<double,PlanePart>(1 - probaP0, PlanePart(frequency + pente1, true)));
        }
    }

    // Cas où l'n change la pièce
    else {
        // La fréquence est remise à 0 mais un vol est tout de même effectué
        // On reste sur la pente basse...
        PlanePartWithProba.push_back(pair<double,PlanePart>(probaP0, PlanePart(pente0, false)));
        // ... ou on bascule sur la pente haute
        PlanePartWithProba.push_back(pair<double,PlanePart>(1 - probaP0, PlanePart(pente1, true)));
    }

    return PlanePartWithProba;
}